

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall higan::EventLoop::AddTimer(EventLoop *this,Timer *timer)

{
  pointer pcVar1;
  LogLevel LVar2;
  string *psVar3;
  TimeStamp *this_00;
  Logger local_358;
  Fmt local_140;
  string local_40;
  
  LVar2 = Logger::GetLogLevel();
  if ((int)LVar2 < 2) {
    Logger::Logger(&local_358,INFO,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/EventLoop.cpp"
                   ,0x81,"AddTimer");
    psVar3 = Timer::GetName_abi_cxx11_(timer);
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    this_00 = Timer::GetExpireTime(timer);
    TimeStamp::FormatToString_abi_cxx11_(&local_40,this_00);
    Fmt::Fmt(&local_140,"add new timer: %s expire: %s",pcVar1,local_40._M_dataplus._M_p);
    Logger::operator<<(&local_358,&local_140);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    Logger::~Logger(&local_358);
  }
  TimerManager::Insert(&this->timer_manager_,timer);
  return;
}

Assistant:

void EventLoop::AddTimer(const Timer& timer)
{
	LOG_INFO << higan::Fmt("add new timer: %s expire: %s", timer.GetName().c_str(),
				timer.GetExpireTime().FormatToString().c_str());
	timer_manager_.Insert(timer);
}